

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

void * xmlIOHTTPOpenW(char *post_uri,int compression)

{
  uint uVar1;
  int iVar2;
  xmlIOHTTPWriteCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlZMemBuffPtr buff;
  uchar *puVar4;
  unsigned_long uVar5;
  char *extra;
  xmlChar axStack_228 [512];
  
  if (post_uri == (char *)0x0) {
    return (void *)0x0;
  }
  ctxt = (xmlIOHTTPWriteCtxtPtr)(*xmlMalloc)(0x18);
  if (ctxt == (xmlIOHTTPWriteCtxtPtr)0x0) {
    xmlIOErrMemory("creating HTTP output context");
    return (void *)0x0;
  }
  *(undefined8 *)ctxt = 0;
  ctxt->uri = (char *)0x0;
  ctxt->doc_buff = (void *)0x0;
  pxVar3 = xmlStrdup((xmlChar *)post_uri);
  ctxt->uri = (char *)pxVar3;
  if (pxVar3 == (xmlChar *)0x0) {
    xmlIOErrMemory("copying URI");
    goto LAB_0019200f;
  }
  if (compression - 1U < 9) {
    ctxt->compression = compression;
    buff = (xmlZMemBuffPtr)(*xmlMalloc)(0x88);
    if (buff == (xmlZMemBuffPtr)0x0) {
      extra = "creating buffer context";
    }
    else {
      (buff->zctrl).adler = 0;
      (buff->zctrl).reserved = 0;
      (buff->zctrl).opaque = (voidpf)0x0;
      *(undefined8 *)&(buff->zctrl).data_type = 0;
      (buff->zctrl).zalloc = (alloc_func)0x0;
      (buff->zctrl).zfree = (free_func)0x0;
      (buff->zctrl).msg = (char *)0x0;
      (buff->zctrl).state = (internal_state *)0x0;
      *(undefined8 *)&(buff->zctrl).avail_out = 0;
      (buff->zctrl).total_out = 0;
      (buff->zctrl).total_in = 0;
      (buff->zctrl).next_out = (Bytef *)0x0;
      (buff->zctrl).next_in = (Bytef *)0x0;
      *(undefined8 *)&(buff->zctrl).avail_in = 0;
      buff->crc = 0;
      buff->zbuff = (uchar *)0x0;
      buff->size = 0x8000;
      puVar4 = (uchar *)(*xmlMalloc)(0x8000);
      buff->zbuff = puVar4;
      if (puVar4 != (uchar *)0x0) {
        uVar1 = deflateInit2_(&buff->zctrl,compression,8,0xfffffffffffffff1,8,0,"1.2.11",0x70);
        if (uVar1 == 0) {
          uVar5 = crc32(0,0,0);
          buff->crc = uVar5;
          iVar2 = snprintf((char *)buff->zbuff,buff->size,"%c%c%c%c%c%c%c%c%c%c",0x1f,0x8b,8,0,0,0,0
                           ,0,0,3);
          (buff->zctrl).next_out = buff->zbuff + iVar2;
          (buff->zctrl).avail_out = (int)buff->size - iVar2;
        }
        else {
          xmlFreeZMemBuff(buff);
          buff = (xmlZMemBuffPtr)0x0;
          xmlStrPrintf(axStack_228,500,"xmlCreateZMemBuff:  %s %d\n",
                       "Error initializing compression context.  ZLIB error:",(ulong)uVar1);
          xmlIOErr(0x60a,(char *)axStack_228);
        }
        goto LAB_00192006;
      }
      xmlFreeZMemBuff(buff);
      extra = "creating buffer";
    }
    xmlIOErrMemory(extra);
    buff = (xmlZMemBuffPtr)0x0;
  }
  else {
    buff = (xmlZMemBuffPtr)xmlAllocOutputBufferInternal((xmlCharEncodingHandlerPtr)0x0);
  }
LAB_00192006:
  ctxt->doc_buff = buff;
  if (buff != (xmlZMemBuffPtr)0x0) {
    return ctxt;
  }
LAB_0019200f:
  xmlFreeHTTPWriteCtxt(ctxt);
  return (void *)0x0;
}

Assistant:

void *
xmlIOHTTPOpenW(const char *post_uri, int compression ATTRIBUTE_UNUSED)
{

    xmlIOHTTPWriteCtxtPtr ctxt = NULL;

    if (post_uri == NULL)
        return (NULL);

    ctxt = xmlMalloc(sizeof(xmlIOHTTPWriteCtxt));
    if (ctxt == NULL) {
	xmlIOErrMemory("creating HTTP output context");
        return (NULL);
    }

    (void) memset(ctxt, 0, sizeof(xmlIOHTTPWriteCtxt));

    ctxt->uri = (char *) xmlStrdup((const xmlChar *)post_uri);
    if (ctxt->uri == NULL) {
	xmlIOErrMemory("copying URI");
        xmlFreeHTTPWriteCtxt(ctxt);
        return (NULL);
    }

    /*
     * **  Since the document length is required for an HTTP post,
     * **  need to put the document into a buffer.  A memory buffer
     * **  is being used to avoid pushing the data to disk and back.
     */

#ifdef LIBXML_ZLIB_ENABLED
    if ((compression > 0) && (compression <= 9)) {

        ctxt->compression = compression;
        ctxt->doc_buff = xmlCreateZMemBuff(compression);
    } else
#endif
    {
        /*  Any character conversions should have been done before this  */

        ctxt->doc_buff = xmlAllocOutputBufferInternal(NULL);
    }

    if (ctxt->doc_buff == NULL) {
        xmlFreeHTTPWriteCtxt(ctxt);
        ctxt = NULL;
    }

    return (ctxt);
}